

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O1

bool __thiscall
PsxRelocator::relocateFile(PsxRelocator *this,PsxRelocatorFile *file,int *relocationAddress)

{
  mapped_type_conflict1 mVar1;
  pointer pPVar2;
  size_t sVar3;
  element_type *peVar4;
  pointer pPVar5;
  pointer pbVar6;
  RelocationAction *action;
  mapped_type_conflict1 *pmVar7;
  long *plVar8;
  uint uVar9;
  PsxRelocatorFile *pPVar10;
  bool bVar11;
  int iVar12;
  string *error;
  long lVar13;
  pointer pPVar14;
  pointer pbVar15;
  pointer pPVar16;
  pointer pPVar17;
  undefined8 uVar18;
  int *__k;
  pointer pPVar19;
  PsxSegment *seg;
  string_view text;
  string_view text_00;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  ByteArray sectionData;
  int index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> symbolOffsets;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> relocationOffsets;
  undefined1 local_128 [72];
  pointer pPStack_e0;
  undefined8 local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long local_a0;
  pointer local_98;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  pPVar10 = (PsxRelocatorFile *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = (long)*relocationAddress;
  pPVar14 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pPVar14 != pPVar2) {
    do {
      local_128._64_4_ = pPVar14->id;
      sVar3 = (pPVar14->data).size_;
      mVar1 = *relocationAddress;
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,(key_type_conflict *)(local_128 + 0x40));
      *pmVar7 = mVar1;
      iVar12 = (int)sVar3 + *relocationAddress;
      *relocationAddress = (-iVar12 & 3U) + iVar12;
      pPVar14 = pPVar14 + 1;
    } while (pPVar14 != pPVar2);
  }
  pPVar19 = (file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar16 = (file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pPVar19 == pPVar16) {
    bVar11 = false;
  }
  else {
    bVar11 = false;
    __k = &pPVar19->segment;
    do {
      switch(((PsxSymbol *)(__k + -10))->type) {
      case Internal:
      case Function:
        peVar4 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,__k);
        pPVar10 = (PsxRelocatorFile *)((long)__k[1] + (long)*pmVar7);
        peVar4->value = (int64_t)pPVar10;
        ((((shared_ptr<Label> *)(__k + 4))->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->defined = true;
        break;
      case InternalID:
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,__k);
        lVar13 = (long)__k[1] + (long)*pmVar7;
        peVar4 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar4->value = lVar13;
        peVar4->defined = true;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_90,__k + 2);
LAB_0016c4a3:
        *pmVar7 = (mapped_type_conflict1)lVar13;
        break;
      case External:
        peVar4 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar4->defined != false) {
          lVar13 = peVar4->value;
          pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_90,__k + 2);
          goto LAB_0016c4a3;
        }
        bVar11 = true;
        pPVar10 = file;
        Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                  (Error,"Undefined external symbol %s in file %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__k + -8),
                   &file->name);
        break;
      case BSS:
        peVar4 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar12 = *relocationAddress;
        peVar4->value = (long)iVar12;
        peVar4->defined = true;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_90,__k + 2);
        *pmVar7 = iVar12;
        uVar9 = (-(*relocationAddress + __k[3]) & 3U) + *relocationAddress + __k[3];
        pPVar10 = (PsxRelocatorFile *)(ulong)uVar9;
        *relocationAddress = uVar9;
      }
      pPVar19 = (pointer)(__k + 8);
      __k = __k + 0x12;
    } while (pPVar19 != pPVar16);
  }
  lVar13 = local_a0;
  if (bVar11) {
    bVar11 = false;
  }
  else {
    local_128._32_8_ = (this->outputData).size_;
    ByteArray::reserveBytes(&this->outputData,*relocationAddress - local_a0,'\0');
    pPVar14 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_98 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pPVar14 != local_98) {
      local_128._32_8_ = local_128._32_8_ - lVar13;
      do {
        ByteArray::ByteArray((ByteArray *)(local_128 + 0x28),&pPVar14->data);
        local_128._0_8_ = (long *)0x0;
        local_128._8_8_ = (long *)0x0;
        local_128._16_8_ = 0;
        pPVar5 = (pPVar14->relocations).
                 super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pPVar17 = (pPVar14->relocations).
                       super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                       super__Vector_impl_data._M_start; pPVar17 != pPVar5; pPVar17 = pPVar17 + 1) {
          local_128._64_8_ = SEXT48(pPVar17->segmentOffset);
          pPVar10 = (PsxRelocatorFile *)0xffffffff;
          if ((pointer)((long)&((pointer)local_128._64_8_)->type + 3U) < (ulong)local_128._48_8_) {
            pPVar10 = (PsxRelocatorFile *)
                      (ulong)*(uint *)((long)&((pointer)local_128._64_8_)->type +
                                      (long)(string *)local_128._40_8_);
          }
          local_d8 = CONCAT44(local_d8._4_4_,(int)pPVar10);
          if (pPVar17->refType == SymblId) {
            pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_90,&pPVar17->referenceId);
            uVar9 = pPVar17->relativeOffset + *pmVar7;
LAB_0016c5e4:
            pPVar10 = (PsxRelocatorFile *)(ulong)uVar9;
            pPStack_e0 = (pointer)(long)(int)uVar9;
          }
          else if (pPVar17->refType == SegmentOffset) {
            pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60,&pPVar17->referenceId);
            uVar9 = pPVar17->referencePos + *pmVar7 + pPVar17->relativeOffset;
            goto LAB_0016c5e4;
          }
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          switch(pPVar17->type) {
          case WordLiteral:
            uVar18 = 2;
            break;
          case UpperImmediate:
            uVar18 = 5;
            break;
          case LowerImmediate:
            uVar18 = 6;
            break;
          case FunctionCall:
            uVar18 = 4;
            break;
          default:
            goto switchD_0016c613_default;
          }
          pPVar10 = (PsxRelocatorFile *)local_128;
          iVar12 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                             (this->reloc,uVar18,local_128 + 0x40,pPVar10,&local_b8);
          if ((char)iVar12 == '\0') {
switchD_0016c613_default:
            pbVar6 = local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar11 = true;
            for (pbVar15 = local_b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar6;
                pbVar15 = pbVar15 + 1) {
              text._M_str = (char *)pPVar10;
              text._M_len = (size_t)(pbVar15->_M_dataplus)._M_p;
              Logger::queueError((Logger *)0x1,(ErrorType)pbVar15->_M_string_length,text);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b8);
        }
        local_128._64_8_ = (pointer)0x0;
        pPStack_e0 = (pointer)0x0;
        local_d8 = 0;
        iVar12 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[5])
                           (this->reloc,local_128,local_128 + 0x40);
        pPVar19 = pPStack_e0;
        if ((char)iVar12 == '\0') {
          bVar11 = true;
          for (pPVar16 = (pointer)local_128._64_8_; pPVar16 != pPVar19;
              pPVar16 = (pointer)((pPVar16->name).field_2._M_local_buf + 8)) {
            text_00._M_str = (char *)pPVar10;
            text_00._M_len = *(size_t *)pPVar16;
            Logger::queueError((Logger *)0x1,(ErrorType)(pPVar16->name)._M_dataplus._M_p,text_00);
          }
        }
        for (plVar8 = (long *)local_128._0_8_; plVar8 != (long *)local_128._8_8_;
            plVar8 = plVar8 + 2) {
          if ((pointer)(*plVar8 + 3U) < (ulong)local_128._48_8_) {
            *(int *)((long)&(((string *)local_128._40_8_)->_M_dataplus)._M_p + *plVar8) =
                 (int)plVar8[1];
          }
        }
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&pPVar14->id);
        pPVar10 = (PsxRelocatorFile *)this;
        memcpy((this->outputData).data_ + *pmVar7 +
               (long)&(((string *)local_128._32_8_)->_M_dataplus)._M_p,(void *)local_128._40_8_,
               local_128._48_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_128 + 0x40));
        if ((long *)local_128._0_8_ != (long *)0x0) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
        }
        ByteArray::~ByteArray((ByteArray *)(local_128 + 0x28));
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != local_98);
    }
    bVar11 = (bool)(bVar11 ^ 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return bVar11;
}

Assistant:

bool PsxRelocator::relocateFile(PsxRelocatorFile& file, int& relocationAddress)
{
	std::map<int,int> relocationOffsets;
	std::map<int,int> symbolOffsets;
	int start = relocationAddress;

	// assign addresses to segments
	for (PsxSegment& seg: file.segments)
	{
		int index = seg.id;
		size_t size = seg.data.size();
		
		relocationOffsets[index] = relocationAddress;
		relocationAddress += (int) size;

		while (relocationAddress % 4)
			relocationAddress++;
	}
	
	// parse/add/relocate symbols
	bool error = false;
	for (PsxSymbol& sym: file.symbols)
	{
		int pos;
		switch (sym.type)
		{
		case PsxSymbolType::Internal:
		case PsxSymbolType::Function:
			sym.label->setValue(relocationOffsets[sym.segment]+sym.offset);
			sym.label->setDefined(true);
			break;
		case PsxSymbolType::InternalID:
			pos = relocationOffsets[sym.segment]+sym.offset;
			sym.label->setValue(pos);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = pos;
			break;
		case PsxSymbolType::BSS:
			sym.label->setValue(relocationAddress);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = relocationAddress;
			relocationAddress += sym.size;
			
			while (relocationAddress % 4)
				relocationAddress++;
			break;
		case PsxSymbolType::External:
			if (!sym.label->isDefined())
			{
				Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",sym.name,file.name);
				error = true;
				continue;
			}
			
			symbolOffsets[sym.id] = (int) sym.label->getValue();
			break;
		}
	}

	if (error)
		return false;

	size_t dataStart = outputData.size();
	outputData.reserveBytes(relocationAddress-start);

	// load code and data
	for (PsxSegment& seg: file.segments)
	{
		// relocate
		ByteArray sectionData = seg.data;

		std::vector<RelocationAction> relocationActions;
		for (PsxRelocation& rel: seg.relocations)
		{
			RelocationData relData;
			int pos = rel.segmentOffset;
			relData.opcodeOffset = pos;
			relData.opcode = sectionData.getDoubleWord(pos);

			switch (rel.refType)
			{
			case PsxRelocationRefType::SymblId:
				relData.relocationBase = symbolOffsets[rel.referenceId]+rel.relativeOffset;
				break;
			case PsxRelocationRefType::SegmentOffset:
				relData.relocationBase = relocationOffsets[rel.referenceId] + rel.referencePos+rel.relativeOffset;
				break;
			}

			std::vector<std::string> errors;
			bool result = false;

			switch (rel.type)
			{
			case PsxRelocationType::WordLiteral:
				result = reloc->relocateOpcode(R_MIPS_32,relData, relocationActions, errors);
				break;
			case PsxRelocationType::UpperImmediate:
				result = reloc->relocateOpcode(R_MIPS_HI16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::LowerImmediate:
				result = reloc->relocateOpcode(R_MIPS_LO16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::FunctionCall:
				result = reloc->relocateOpcode(R_MIPS_26,relData, relocationActions, errors);
				break;
			}

			if (!result)
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}
		}

		// finish any dangling relocations
		std::vector<std::string> errors;
		if (!reloc->finish(relocationActions, errors))
		{
			for (const std::string& error : errors)
			{
				Logger::queueError(Logger::Error, error);
			}
			error = true;
		}

		// now actually write the relocated values
		for (const RelocationAction& action : relocationActions)
		{
			sectionData.replaceDoubleWord(action.offset, action.newValue);
		}

		size_t arrayStart = dataStart+relocationOffsets[seg.id]-start;
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}

	return !error;
}